

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uts-seq.c
# Opt level: O2

Result * parTreeSearch(Result *__return_storage_ptr__,int depth,Node *parent)

{
  int iVar1;
  int iVar2;
  int iVar3;
  counter_t cVar4;
  counter_t cVar5;
  int spawnnumber;
  ulong uVar6;
  int iVar7;
  Result c;
  Node child;
  
  iVar1 = parent->height;
  uVar6 = (ulong)depth;
  __return_storage_ptr__->maxdepth = uVar6;
  __return_storage_ptr__->size = 1;
  iVar2 = uts_numChildren(parent);
  iVar3 = uts_childType(parent);
  parent->numChildren = iVar2;
  if (iVar2 < 1) {
    cVar4 = 1;
  }
  else {
    cVar4 = 0;
    cVar5 = 1;
    for (spawnnumber = 0; spawnnumber != iVar2; spawnnumber = spawnnumber + 1) {
      child.numChildren = -1;
      child.type = iVar3;
      child.height = iVar1 + 1;
      for (iVar7 = 0; iVar7 < computeGranularity; iVar7 = iVar7 + 1) {
        rng_spawn((parent->state).state,child.state.state,spawnnumber);
      }
      parTreeSearch(&c,depth + 1,&child);
      if (uVar6 < c.maxdepth) {
        uVar6 = c.maxdepth;
      }
      cVar5 = cVar5 + c.size;
      cVar4 = cVar4 + c.leaves;
    }
    __return_storage_ptr__->maxdepth = uVar6;
    __return_storage_ptr__->size = cVar5;
  }
  __return_storage_ptr__->leaves = cVar4;
  return __return_storage_ptr__;
}

Assistant:

Result parTreeSearch(int depth, Node *parent) {
  int numChildren, childType;
  counter_t parentHeight = parent->height;

  Result r = { depth, 1, 0 };

  numChildren = uts_numChildren(parent);
  childType   = uts_childType(parent);

  // record number of children in parent
  parent->numChildren = numChildren;
  
  // Recurse on the children
  if (numChildren > 0) {
    int i, j;
    for (i = 0; i < numChildren; i++) {
      Node child;
      child.type = childType;
      child.height = parentHeight + 1;
      child.numChildren = -1;    // not yet determined
      for (j = 0; j < computeGranularity; j++) {
        rng_spawn(parent->state.state, child.state.state, i);
      }
      Result c = parTreeSearch(depth+1, &child);
      if (c.maxdepth>r.maxdepth) r.maxdepth = c.maxdepth;
      r.size += c.size;
      r.leaves += c.leaves;
    }
  } else {
    r.leaves = 1;
  }

  return r;
}